

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O3

Iterator * __thiscall
PatternSelection::iterator(Iterator *__return_storage_ptr__,PatternSelection *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar5._0_4_ = (this->mStart).super_PatternCursorBase.row;
  uVar5._4_4_ = (this->mStart).super_PatternCursorBase.column;
  uVar3 = uVar5 >> 0x20;
  iVar1 = (this->mStart).super_PatternCursorBase.track;
  uVar9._0_4_ = (this->mEnd).super_PatternCursorBase.row;
  uVar9._4_4_ = (this->mEnd).super_PatternCursorBase.column;
  uVar7 = uVar9 >> 0x20;
  iVar2 = (this->mEnd).super_PatternCursorBase.track;
  uVar4 = uVar3;
  iVar6 = iVar1;
  iVar8 = iVar2;
  if ((iVar1 <= iVar2) &&
     (iVar6 = iVar2, iVar8 = iVar1, iVar1 != iVar2 || (int)uVar5._4_4_ <= (int)uVar9._4_4_)) {
    uVar4 = uVar7;
    uVar7 = uVar3;
  }
  uVar3 = uVar9;
  if ((int)(undefined4)uVar9 < (int)(undefined4)uVar5) {
    uVar3 = uVar5;
  }
  if ((int)(undefined4)uVar5 < (int)(undefined4)uVar9) {
    uVar9 = uVar5;
  }
  uVar5 = uVar9 & 0xffffffff | uVar7 << 0x20;
  uVar9 = uVar3 & 0xffffffff | uVar4 << 0x20;
  (__return_storage_ptr__->mStart).super_PatternCursorBase.row = (int)uVar5;
  (__return_storage_ptr__->mStart).super_PatternCursorBase.column = (int)(uVar5 >> 0x20);
  (__return_storage_ptr__->mStart).super_PatternCursorBase.track = iVar8;
  (__return_storage_ptr__->mEnd).super_PatternCursorBase.row = (int)uVar9;
  (__return_storage_ptr__->mEnd).super_PatternCursorBase.column = (int)(uVar9 >> 0x20);
  (__return_storage_ptr__->mEnd).super_PatternCursorBase.track = iVar6;
  return __return_storage_ptr__;
}

Assistant:

PatternSelection::Iterator PatternSelection::iterator() const {
    auto start = mStart;
    auto end = mEnd;

    // normalize coordinates

    if (start.row > end.row) {
        std::swap(start.row, end.row);
    }


    if (start.track > end.track) {
        std::swap(start.track, end.track);
        std::swap(start.column, end.column);
    } else if (start.track == end.track && start.column > end.column) {
        std::swap(start.column, end.column);
    }
    

    return {start, end};
}